

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.cc
# Opt level: O0

bool __thiscall draco::BoundingBox::IsValid(BoundingBox *this)

{
  Scalar *pSVar1;
  BoundingBox *in_RDI;
  float fVar2;
  float fVar3;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Scalar SVar4;
  undefined1 local_9;
  
  GetMinPoint(in_RDI);
  pSVar1 = VectorD<float,_3>::operator[]
                     ((VectorD<float,_3> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  fVar3 = *pSVar1;
  fVar2 = std::numeric_limits<float>::max();
  local_9 = false;
  if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
    GetMinPoint(in_RDI);
    pSVar1 = VectorD<float,_3>::operator[]
                       ((VectorD<float,_3> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    fVar3 = *pSVar1;
    fVar2 = std::numeric_limits<float>::max();
    local_9 = false;
    if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
      GetMinPoint(in_RDI);
      pSVar1 = VectorD<float,_3>::operator[]
                         ((VectorD<float,_3> *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffcc);
      fVar3 = *pSVar1;
      fVar2 = std::numeric_limits<float>::max();
      local_9 = false;
      if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
        GetMaxPoint(in_RDI);
        pSVar1 = VectorD<float,_3>::operator[]
                           ((VectorD<float,_3> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc);
        fVar3 = *pSVar1;
        fVar2 = std::numeric_limits<float>::lowest();
        local_9 = false;
        if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
          GetMaxPoint(in_RDI);
          pSVar1 = VectorD<float,_3>::operator[]
                             ((VectorD<float,_3> *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
          fVar3 = *pSVar1;
          fVar2 = std::numeric_limits<float>::lowest();
          local_9 = false;
          if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
            GetMaxPoint(in_RDI);
            pSVar1 = VectorD<float,_3>::operator[]
                               ((VectorD<float,_3> *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc);
            SVar4 = *pSVar1;
            fVar3 = std::numeric_limits<float>::lowest();
            local_9 = SVar4 != fVar3;
          }
        }
      }
    }
  }
  return local_9;
}

Assistant:

const bool BoundingBox::IsValid() const {
  return GetMinPoint()[0] != std::numeric_limits<float>::max() &&
         GetMinPoint()[1] != std::numeric_limits<float>::max() &&
         GetMinPoint()[2] != std::numeric_limits<float>::max() &&
         GetMaxPoint()[0] != std::numeric_limits<float>::lowest() &&
         GetMaxPoint()[1] != std::numeric_limits<float>::lowest() &&
         GetMaxPoint()[2] != std::numeric_limits<float>::lowest();
}